

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

SourceLocation __thiscall
slang::SourceManager::getFullyOriginalLoc(SourceManager *this,SourceLocation location)

{
  bool bVar1;
  shared_lock<std::shared_mutex> lock;
  shared_lock<std::shared_mutex> local_28;
  
  local_28._M_owns = true;
  local_28._M_pm = &this->mutex;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  while( true ) {
    bVar1 = isMacroLocImpl<std::shared_lock<std::shared_mutex>_>(this,location,&local_28);
    if (!bVar1) break;
    location = getOriginalLocImpl<std::shared_lock<std::shared_mutex>_>(this,location,&local_28);
  }
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_28);
  return location;
}

Assistant:

SourceLocation SourceManager::getFullyOriginalLoc(SourceLocation location) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    while (isMacroLocImpl(location, lock))
        location = getOriginalLocImpl(location, lock);
    return location;
}